

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O2

uint64_t aom_sum_sse_2d_i16_sse2(int16_t *src,int src_stride,int width,int height,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint64_t uVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar16;
  uint uVar17;
  undefined1 auVar15 [16];
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if ((width == 4) && (height == 4)) {
    uVar4 = aom_sum_sse_2d_i16_4x4_sse2(src,src_stride,sum);
    return uVar4;
  }
  if ((width == 4) && ((height & 3U) == 0)) {
    uVar4 = aom_sum_sse_2d_i16_4xn_sse2(src,src_stride,height,sum);
    return uVar4;
  }
  if ((height & 3U) != 0 || (width & 7U) != 0) {
    uVar4 = aom_sum_sse_2d_i16_c(src,src_stride,width,height,sum);
    return uVar4;
  }
  iVar6 = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  iVar13 = 0;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar7 = 0;
    uVar14 = 0;
    uVar16 = 0;
    uVar17 = 0;
    uVar18 = 0;
    pauVar5 = (undefined1 (*) [16])src;
    do {
      auVar19 = *pauVar5;
      auVar1 = *(undefined1 (*) [16])(*pauVar5 + (long)src_stride * 2);
      auVar2 = *(undefined1 (*) [16])(*pauVar5 + (long)(src_stride * 2) * 2);
      auVar20 = pmaddwd(auVar19,auVar19);
      auVar3 = *(undefined1 (*) [16])(*pauVar5 + (long)(src_stride * 3) * 2);
      auVar21 = pmaddwd(auVar1,auVar1);
      auVar22 = pmaddwd(auVar2,auVar2);
      auVar15 = pmaddwd(auVar3,auVar3);
      uVar14 = auVar15._0_4_ + auVar22._0_4_ + auVar21._0_4_ + auVar20._0_4_ + uVar14;
      uVar16 = auVar15._4_4_ + auVar22._4_4_ + auVar21._4_4_ + auVar20._4_4_ + uVar16;
      uVar17 = auVar15._8_4_ + auVar22._8_4_ + auVar21._8_4_ + auVar20._8_4_ + uVar17;
      uVar18 = auVar15._12_4_ + auVar22._12_4_ + auVar21._12_4_ + auVar20._12_4_ + uVar18;
      auVar15._0_2_ = auVar1._0_2_ + auVar19._0_2_ + auVar2._0_2_ + auVar3._0_2_;
      auVar15._2_2_ = auVar1._2_2_ + auVar19._2_2_ + auVar2._2_2_ + auVar3._2_2_;
      auVar15._4_2_ = auVar1._4_2_ + auVar19._4_2_ + auVar2._4_2_ + auVar3._4_2_;
      auVar15._6_2_ = auVar1._6_2_ + auVar19._6_2_ + auVar2._6_2_ + auVar3._6_2_;
      auVar15._8_2_ = auVar1._8_2_ + auVar19._8_2_ + auVar2._8_2_ + auVar3._8_2_;
      auVar15._10_2_ = auVar1._10_2_ + auVar19._10_2_ + auVar2._10_2_ + auVar3._10_2_;
      auVar15._12_2_ = auVar1._12_2_ + auVar19._12_2_ + auVar2._12_2_ + auVar3._12_2_;
      auVar15._14_2_ = auVar1._14_2_ + auVar19._14_2_ + auVar2._14_2_ + auVar3._14_2_;
      auVar19 = pmaddwd(auVar15,_DAT_004684f0);
      iVar10 = iVar10 + auVar19._0_4_;
      iVar11 = iVar11 + auVar19._4_4_;
      iVar12 = iVar12 + auVar19._8_4_;
      iVar13 = iVar13 + auVar19._12_4_;
      lVar7 = lVar7 + 8;
      pauVar5 = pauVar5 + 1;
    } while (lVar7 < width);
    lVar8 = lVar8 + (ulong)uVar17 + (ulong)uVar14;
    lVar9 = lVar9 + (ulong)uVar18 + (ulong)uVar16;
    iVar6 = iVar6 + 4;
    src = (int16_t *)(*(undefined1 (*) [16])src + (long)(src_stride * 4) * 2);
  } while (iVar6 < height);
  *sum = *sum + iVar13 + iVar11 + iVar12 + iVar10;
  return lVar9 + lVar8;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_sse2(const int16_t *src, int src_stride, int width,
                                 int height, int *sum) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_sse_2d_i16_4x4_sse2(src, src_stride, sum);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_4xn_sse2(src, src_stride, height, sum);
  } else if (LIKELY((width & 7) == 0 && (height & 3) == 0)) {
    // Generic case
    return aom_sum_sse_2d_i16_nxn_sse2(src, src_stride, width, height, sum);
  } else {
    return aom_sum_sse_2d_i16_c(src, src_stride, width, height, sum);
  }
}